

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

matches * matchimm(disctx *ctx,bitfield *bf,int spos)

{
  line *plVar1;
  int iVar2;
  matches *__ptr;
  match *res;
  
  plVar1 = ctx->line;
  if (plVar1->atomsnum != spos) {
    __ptr = (matches *)calloc(0x10,1);
    __ptr->mmax = 0x10;
    res = (match *)malloc(0xb80);
    __ptr->m = res;
    __ptr->mnum = 1;
    *(undefined8 *)res = 0;
    res->a[0] = 0;
    res->a[1] = 0;
    res->m[0] = 0;
    res->m[1] = 0;
    res->lpos = spos + 1;
    memset(&res->field_0x2c,0,0x8c);
    iVar2 = setbfe(res,bf,plVar1->atoms[spos]);
    if (iVar2 != 0) {
      return __ptr;
    }
    free(res);
    free(__ptr);
  }
  return (matches *)0x0;
}

Assistant:

struct matches *matchimm (struct disctx *ctx, const struct bitfield *bf, int spos) {
	if (spos == ctx->line->atomsnum)
		return 0;
	struct matches *res = alwaysmatches(spos+1);
	if (setbfe(res->m, bf, ctx->line->atoms[spos]))
		return res;
	else {
		free(res->m);
		free(res);
		return 0;
	}
}